

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::stopReplay
          (ArchiveProxy *this,int64_t replaySessionId,int64_t correlationId,int64_t controlSessionId
          )

{
  bool bVar1;
  StopReplayRequest *pSVar2;
  uint64_t uVar3;
  undefined1 local_60 [8];
  StopReplayRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t replaySessionId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::StopReplayRequest::StopReplayRequest((StopReplayRequest *)local_60);
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopReplayRequest>
                     (this,(StopReplayRequest *)local_60);
  pSVar2 = io::aeron::archive::codecs::StopReplayRequest::controlSessionId
                     (pSVar2,msg.m_actingVersion);
  pSVar2 = io::aeron::archive::codecs::StopReplayRequest::correlationId(pSVar2,correlationId);
  io::aeron::archive::codecs::StopReplayRequest::replaySessionId(pSVar2,replaySessionId);
  uVar3 = io::aeron::archive::codecs::StopReplayRequest::encodedLength
                    ((StopReplayRequest *)local_60);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::stopReplay(std::int64_t replaySessionId, std::int64_t correlationId, std::int64_t controlSessionId) {
    codecs::StopReplayRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .replaySessionId(replaySessionId);

    return offer(msg.encodedLength());
}